

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3ColumnMethod(sqlite3_vtab_cursor *pCursor,sqlite3_context *pCtx,int iCol)

{
  Mem *pContext;
  int iVar1;
  int iVar2;
  int in_EDX;
  sqlite3_value *in_RSI;
  sqlite3_context *in_RDI;
  Fts3Table *p;
  Fts3Cursor *pCsr;
  int rc;
  _func_void_void_ptr *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  int local_18;
  int local_14;
  
  local_18 = 0;
  pContext = in_RDI->pOut;
  iVar1 = in_EDX - *(int *)&pContext->xDel;
  if (iVar1 == 0) {
    sqlite3_result_pointer
              (in_RDI,pContext,(char *)(ulong)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else if (iVar1 == 1) {
    sqlite3_result_int64
              ((sqlite3_context *)CONCAT44(1,in_stack_ffffffffffffffd0),
               (i64)in_stack_ffffffffffffffc8);
  }
  else {
    local_14 = in_EDX;
    if (iVar1 == 2) {
      if (in_RDI->pVdbe != (Vdbe *)0x0) {
        sqlite3_result_int64
                  ((sqlite3_context *)CONCAT44(2,in_stack_ffffffffffffffd0),
                   (i64)in_stack_ffffffffffffffc8);
        return 0;
      }
      if (*(long *)&pContext[1].szMalloc == 0) {
        sqlite3_result_int((sqlite3_context *)CONCAT44(2,in_stack_ffffffffffffffd0),
                           (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
        return 0;
      }
      local_14 = *(int *)&pContext->xDel;
    }
    local_18 = fts3CursorSeek((sqlite3_context *)pContext,
                              (Fts3Cursor *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
    if ((local_18 == 0) &&
       (iVar2 = sqlite3_data_count((sqlite3_stmt *)in_RDI->pMem), local_14 < iVar2 + -1)) {
      sqlite3_column_value
                ((sqlite3_stmt *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                 (int)((ulong)in_RSI >> 0x20));
      sqlite3_result_value((sqlite3_context *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),in_RSI);
    }
  }
  return local_18;
}

Assistant:

static int fts3ColumnMethod(
  sqlite3_vtab_cursor *pCursor,   /* Cursor to retrieve value from */
  sqlite3_context *pCtx,          /* Context for sqlite3_result_xxx() calls */
  int iCol                        /* Index of column to read value from */
){
  int rc = SQLITE_OK;             /* Return Code */
  Fts3Cursor *pCsr = (Fts3Cursor *) pCursor;
  Fts3Table *p = (Fts3Table *)pCursor->pVtab;

  /* The column value supplied by SQLite must be in range. */
  assert( iCol>=0 && iCol<=p->nColumn+2 );

  switch( iCol-p->nColumn ){
    case 0:
      /* The special 'table-name' column */
      sqlite3_result_pointer(pCtx, pCsr, "fts3cursor", 0);
      break;

    case 1:
      /* The docid column */
      sqlite3_result_int64(pCtx, pCsr->iPrevId);
      break;

    case 2:
      if( pCsr->pExpr ){
        sqlite3_result_int64(pCtx, pCsr->iLangid);
        break;
      }else if( p->zLanguageid==0 ){
        sqlite3_result_int(pCtx, 0);
        break;
      }else{
        iCol = p->nColumn;
        /* no break */ deliberate_fall_through
      }

    default:
      /* A user column. Or, if this is a full-table scan, possibly the
      ** language-id column. Seek the cursor. */
      rc = fts3CursorSeek(0, pCsr);
      if( rc==SQLITE_OK && sqlite3_data_count(pCsr->pStmt)-1>iCol ){
        sqlite3_result_value(pCtx, sqlite3_column_value(pCsr->pStmt, iCol+1));
      }
      break;
  }

  assert( ((Fts3Table *)pCsr->base.pVtab)->pSegments==0 );
  return rc;
}